

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O3

bool wasm::anon_unknown_0::shapeEq(HeapType a,HeapType b)

{
  pointer pFVar1;
  bool bVar2;
  Struct *pSVar3;
  Struct *pSVar4;
  pointer pFVar5;
  long lVar6;
  ulong uVar7;
  Signature SVar8;
  Signature SVar9;
  HeapType local_60;
  long local_58;
  HeapType local_50;
  long local_48;
  HeapType local_40;
  HeapType a_local;
  HeapType b_local;
  
  local_40.id = a.id;
  a_local = b;
  bVar2 = HeapType::isStruct(&local_40);
  if ((bVar2) && (bVar2 = HeapType::isStruct(&a_local), bVar2)) {
    pSVar3 = HeapType::getStruct(&local_40);
    pSVar4 = HeapType::getStruct(&a_local);
    pFVar5 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((long)pFVar1 - (long)pFVar5 ==
        (long)(pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(pSVar4->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl
              .super__Vector_impl_data._M_start) {
      if (pFVar1 == pFVar5) {
        return true;
      }
      lVar6 = 8;
      uVar7 = 0;
      while ((pFVar1 = (pSVar4->fields).
                       super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                       super__Vector_impl_data._M_start,
             *(long *)((long)&(pFVar5->type).id + lVar6) ==
             *(long *)((long)&(pFVar1->type).id + lVar6) &&
             (bVar2 = shapeEq((Type)*(uintptr_t *)((long)pFVar5 + lVar6 + -8),
                              (Type)*(uintptr_t *)((long)pFVar1 + lVar6 + -8)), bVar2))) {
        uVar7 = uVar7 + 1;
        pFVar5 = (pSVar3->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 0x10;
        if ((ulong)((long)(pSVar3->fields).
                          super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)pFVar5 >> 4) <= uVar7) {
          return true;
        }
      }
    }
  }
  else {
    bVar2 = HeapType::isArray(&local_40);
    if ((bVar2) && (bVar2 = HeapType::isArray(&a_local), bVar2)) {
      HeapType::getArray(&local_60);
      HeapType::getArray(&local_50);
      if (local_58 == local_48) {
LAB_008c2b9f:
        bVar2 = shapeEq((Type)local_60.id,(Type)local_50.id);
        return bVar2;
      }
    }
    else {
      bVar2 = HeapType::isSignature(&local_40);
      if ((bVar2) && (bVar2 = HeapType::isSignature(&a_local), bVar2)) {
        SVar8 = HeapType::getSignature(&local_40);
        SVar9 = HeapType::getSignature(&a_local);
        bVar2 = shapeEq(SVar8.params.id,SVar9.params.id);
        local_50.id = SVar9.results.id.id;
        local_60.id = SVar8.results.id.id;
        if (bVar2) goto LAB_008c2b9f;
      }
    }
  }
  return false;
}

Assistant:

bool shapeEq(HeapType a, HeapType b) {
  // Check whether `a` and `b` have the same top-level structure, including the
  // position and identity of any children that are not included as transitions
  // in the DFA, i.e. any children that are not nontrivial references.
  if (a.isStruct() && b.isStruct()) {
    return shapeEq(a.getStruct(), b.getStruct());
  }
  if (a.isArray() && b.isArray()) {
    return shapeEq(a.getArray(), b.getArray());
  }
  if (a.isSignature() && b.isSignature()) {
    return shapeEq(a.getSignature(), b.getSignature());
  }
  return false;
}